

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Editor.cpp
# Opt level: O3

void __thiscall Editor::deleteArea(Editor *this)

{
  _Rb_tree_color _Var1;
  undefined8 uVar2;
  bool bVar3;
  uint uVar4;
  Blank *type;
  uint uVar5;
  __uniq_ptr_data<gui::Theme,_std::default_delete<gui::Theme>,_true,_true> _Var6;
  int i;
  int iVar7;
  uint uVar8;
  uint tileIndex;
  ulong uVar9;
  int iVar10;
  pair<sf::Vector2<int>,_sf::Vector2<int>_> pVar11;
  Tile tile;
  undefined1 local_d0 [136];
  Tile local_48;
  
  pVar11 = Board::getHighlightedBounds(this->board_);
  local_d0._48_8_ = pVar11.second;
  iVar7 = pVar11.first.x;
  if (iVar7 <= pVar11.second.x) {
    local_d0._40_8_ = this;
    makeCommand<commands::FillArea,Board&,TilePool&>
              ((Editor *)local_d0,(Board *)this,(TilePool *)this->board_);
    local_d0._104_8_ = (ulong)pVar11.first >> 0x20;
    uVar8 = pVar11.first.y >> 5;
    local_d0._16_8_ = ZEXT48(uVar8);
    local_d0._96_8_ = (ulong)local_d0._48_8_ >> 0x20;
    local_d0._32_4_ = pVar11.second.y >> 5;
    if ((int)uVar8 <= (int)local_d0._32_4_) {
      local_d0._12_4_ = iVar7 >> 5;
      local_d0._28_4_ = pVar11.second.x >> 5;
      local_d0._36_4_ = local_d0._28_4_;
      if ((int)local_d0._28_4_ < (int)local_d0._12_4_) {
        local_d0._36_4_ = local_d0._12_4_;
      }
      local_d0._64_8_ = *(Board **)(local_d0._40_8_ + 0x78);
      do {
        if ((int)local_d0._12_4_ <= (int)local_d0._28_4_) {
          uVar4 = (uint)local_d0._16_8_;
          local_d0._72_8_ = (ulong)(uVar4 | 0x80000000) << 0x20;
          uVar8 = local_d0._12_4_;
          do {
            _Var6.super___uniq_ptr_impl<gui::Theme,_std::default_delete<gui::Theme>_>._M_t.
            super__Tuple_impl<0UL,_gui::Theme_*,_std::default_delete<gui::Theme>_>.
            super__Head_base<0UL,_gui::Theme_*,_false>._M_head_impl._4_4_ = 0;
            _Var6.super___uniq_ptr_impl<gui::Theme,_std::default_delete<gui::Theme>_>._M_t.
            super__Tuple_impl<0UL,_gui::Theme_*,_std::default_delete<gui::Theme>_>.
            super__Head_base<0UL,_gui::Theme_*,_false>._M_head_impl._0_4_ = uVar8;
            local_d0._88_8_ =
                 Board::accessChunk((Board *)local_d0._64_8_,
                                    (ulong)(uVar8 | 0x80000000) | local_d0._72_8_);
            uVar9 = 0;
            local_d0._80_8_ =
                 _Var6.super___uniq_ptr_impl<gui::Theme,_std::default_delete<gui::Theme>_>._M_t.
                 super__Tuple_impl<0UL,_gui::Theme_*,_std::default_delete<gui::Theme>_>.
                 super__Head_base<0UL,_gui::Theme_*,_false>._M_head_impl;
            do {
              tileIndex = (uint)uVar9;
              uVar5 = tileIndex & 0x1f | uVar8 << 5;
              if ((((iVar7 <= (int)uVar5) && ((int)uVar5 <= (int)local_d0._48_4_)) &&
                  (iVar10 = (int)(uVar9 >> 5) + uVar4 * 0x20, (int)local_d0._104_4_ <= iVar10)) &&
                 (iVar10 <= (int)local_d0._96_4_)) {
                Chunk::accessTile((Tile *)(local_d0 + 0x70),(Chunk *)local_d0._88_8_,tileIndex);
                bVar3 = Tile::getHighlight((Tile *)(local_d0 + 0x70));
                if (bVar3) {
                  local_d0._56_4_ = uVar5;
                  local_d0._60_4_ = iVar10;
                  commands::PlaceTiles::pushBackTile
                            (&local_48,(PlaceTiles *)local_d0._0_8_,(Vector2i *)(local_d0 + 0x38));
                  type = tiles::Blank::instance();
                  Tile::setType(&local_48,type);
                }
              }
              uVar9 = (ulong)(tileIndex + 1);
            } while (tileIndex + 1 != 0x400);
            uVar8 = (uint)local_d0._80_8_ + 1;
          } while ((uint)local_d0._80_8_ != local_d0._36_4_);
        }
        _Var1 = (_Rb_tree_color)local_d0._16_8_;
        local_d0._16_8_ = ZEXT48(_Var1 + _S_black);
      } while (_Var1 != local_d0._32_4_);
    }
    uVar2 = local_d0._40_8_;
    local_d0._112_8_ = local_d0._0_8_;
    local_d0._0_8_ = (_func_int **)0x0;
    executeCommand((Editor *)local_d0._40_8_,
                   (unique_ptr<Command,_std::default_delete<Command>_> *)(local_d0 + 0x70));
    if ((PlaceTiles *)local_d0._112_8_ != (PlaceTiles *)0x0) {
      (*((Command *)local_d0._112_8_)->_vptr_Command[1])();
    }
    Board::removeAllHighlights(*(Board **)(uVar2 + 0x78));
    if ((_func_int **)local_d0._0_8_ != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)local_d0._0_8_ + 8))();
    }
  }
  return;
}

Assistant:

void Editor::deleteArea() {
    auto bounds = board_.getHighlightedBounds();
    if (bounds.first.x > bounds.second.x) {
        return;
    }
    auto command = makeCommand<commands::FillArea>(board_, tilePool_);
    forEachTile(board_, bounds.first, bounds.second, [&command](Chunk& chunk, int i, int x, int y) {
        Tile tile = chunk.accessTile(i);
        if (tile.getHighlight()) {
            command->pushBackTile({x, y}).setType(tiles::Blank::instance());
        }
    });
    executeCommand(std::move(command));
    board_.removeAllHighlights();
}